

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadComponentIndex(ON_BinaryArchive *this,ON_COMPONENT_INDEX *ci)

{
  bool bVar1;
  TYPE TVar2;
  int t;
  int local_1c;
  
  ci->m_type = invalid_type;
  ci->m_index = 0;
  bVar1 = ReadInt32(this,1,&local_1c);
  if (bVar1) {
    bVar1 = ReadInt32(this,1,&ci->m_index);
    if (bVar1) {
      TVar2 = ON_COMPONENT_INDEX::Type(local_1c);
      ci->m_type = TVar2;
    }
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadComponentIndex(
		ON_COMPONENT_INDEX& ci
		)
{
  int t;
  ci.m_type = ON_COMPONENT_INDEX::invalid_type;
  ci.m_index = 0;
  bool rc = ReadInt( &t );
  if (rc)
  {
    rc = ReadInt( &ci.m_index );
    if (rc)
    {
      ci.m_type = ON_COMPONENT_INDEX::Type(t);
    }
    // do not add additional read - you will break old file IO
  }
  return rc;
}